

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_pad(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  undefined4 *puVar14;
  long lVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  undefined4 uVar24;
  long local_b0;
  undefined4 *local_a8;
  long local_a0;
  undefined4 *local_90;
  long local_88;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a0a,"fatal error");
  }
  if (pgVar1->nb[0] == 4) {
    if (dst->nb[0] == 4) {
      lVar2 = dst->ne[2];
      if (0 < lVar2) {
        lVar3 = pgVar1->ne[2];
        lVar19 = (long)params->nth;
        lVar4 = pgVar1->ne[1];
        lVar5 = dst->ne[1];
        lVar17 = (long)params->ith;
        lVar6 = dst->ne[0];
        lVar7 = pgVar1->ne[0];
        lVar8 = dst->ne[3];
        lVar9 = pgVar1->ne[3];
        local_a0 = 0;
        sVar10 = pgVar1->nb[1];
        local_88 = sVar10 * lVar17;
        local_90 = (undefined4 *)((long)dst->data + lVar6 * lVar17 * 4);
        sVar11 = pgVar1->nb[3];
        sVar12 = pgVar1->nb[2];
        do {
          if (lVar17 < lVar5) {
            local_a8 = local_90;
            local_b0 = local_88;
            lVar15 = lVar17;
            do {
              if (0 < lVar6) {
                lVar23 = 0;
                puVar14 = local_a8;
                lVar18 = local_b0;
                do {
                  if (0 < lVar8) {
                    lVar20 = 0;
                    lVar21 = lVar18;
                    puVar22 = puVar14;
                    do {
                      uVar24 = 0;
                      if (lVar20 < lVar9 && ((lVar23 < lVar7 && lVar15 < lVar4) && local_a0 < lVar3)
                         ) {
                        uVar24 = *(undefined4 *)((long)pgVar1->data + lVar21);
                      }
                      *puVar22 = uVar24;
                      lVar20 = lVar20 + 1;
                      lVar21 = lVar21 + sVar11;
                      puVar22 = puVar22 + lVar5 * lVar6 * lVar2;
                    } while (lVar8 != lVar20);
                  }
                  lVar23 = lVar23 + 1;
                  lVar18 = lVar18 + 4;
                  puVar14 = puVar14 + 1;
                } while (lVar23 != lVar6);
              }
              lVar15 = lVar15 + lVar19;
              local_b0 = local_b0 + sVar10 * lVar19;
              local_a8 = local_a8 + lVar6 * lVar19;
            } while (lVar15 < lVar5);
          }
          local_88 = local_88 + sVar12;
          local_90 = local_90 + lVar5 * lVar6;
          local_a0 = local_a0 + 1;
        } while (local_a0 != lVar2);
      }
      return;
    }
    pcVar13 = "dst->nb[0] == sizeof(float)";
    uVar16 = 0x19df;
  }
  else {
    pcVar13 = "src0->nb[0] == sizeof(float)";
    uVar16 = 0x19de;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar16,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void ggml_compute_forward_pad(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_pad_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}